

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O2

bool __thiscall SecureDataManager::setUserPIN(SecureDataManager *this,ByteString *userPIN)

{
  bool bVar1;
  size_t sVar2;
  int lineNo;
  char *format;
  
  if ((this->soLoggedIn == false) && (this->userLoggedIn == false)) {
    format = "Must be logged in to change the user PIN";
    lineNo = 0xe6;
  }
  else {
    sVar2 = ByteString::size(userPIN);
    if (sVar2 != 0) {
      bVar1 = pbeEncryptKey(this,userPIN,&this->userEncryptedKey);
      return bVar1;
    }
    format = "Zero length PIN specified";
    lineNo = 0xee;
  }
  softHSMLog(7,"setUserPIN",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
             ,lineNo,format);
  return false;
}

Assistant:

bool SecureDataManager::setUserPIN(const ByteString& userPIN)
{
	// Check if the SO or the user is logged in
	if (!soLoggedIn && !userLoggedIn)
	{
		DEBUG_MSG("Must be logged in to change the user PIN");

		return false;
	}

	// Check the new PIN
	if (userPIN.size() == 0)
	{
		DEBUG_MSG("Zero length PIN specified");

		return false;
	}

	return pbeEncryptKey(userPIN, userEncryptedKey);
}